

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptm_mgau.c
# Opt level: O3

int32 read_sendump(s2_semi_mgau_t *s,bin_mdef_t *mdef,char *file)

{
  int32 iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  FILE *__stream;
  size_t sVar5;
  mmio_file_t *mf;
  void *pvVar6;
  uint8 *__ptr;
  uint8 ***pppuVar7;
  char *pcVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  size_t sVar14;
  ulong uVar15;
  int32 iVar16;
  uint uVar17;
  ulong uVar18;
  char line [1000];
  uint local_460;
  uint local_45c;
  uint local_458;
  int local_454;
  ulong local_450;
  uint local_444;
  ulong local_440;
  uint local_434;
  ulong local_430;
  ulong local_428;
  undefined8 local_420;
  undefined5 local_418;
  undefined1 uStack_413;
  undefined2 uStack_412;
  int local_410;
  char local_40c;
  char local_40b;
  char local_40a [986];
  
  uVar11 = (ulong)mdef & 0xffffffff;
  iVar16 = s->g->n_feat;
  iVar1 = s->g->n_density;
  s->n_sen = (int32)mdef;
  iVar2 = ps_config_bool(s->config,"mmap");
  local_428 = CONCAT44(local_428._4_4_,iVar2);
  __stream = fopen(file,"rb");
  if (__stream == (FILE *)0x0) {
    return -1;
  }
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
          ,0x389,"Loading senones from dump file %s\n",file);
  sVar5 = fread(&local_45c,4,1,__stream);
  if (sVar5 != 1) {
    pcVar8 = "Failed to read title size from %s";
    lVar9 = 0x38c;
    goto LAB_001413da;
  }
  local_440 = CONCAT44(local_440._4_4_,iVar1);
  uVar3 = local_45c - 1;
  if ((0x3e6 < uVar3) &&
     (local_45c = local_45c >> 0x18 | (local_45c & 0xff0000) >> 8 | (local_45c & 0xff00) << 8 |
                  local_45c << 0x18, local_45c - 1000 < 0xfffffc19)) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
            ,0x394,"Title length %x in dump file %s out of range\n",(ulong)local_45c,file);
    goto LAB_0014145b;
  }
  uVar13 = local_45c;
  local_450 = CONCAT44(local_450._4_4_,iVar16);
  uVar15 = (ulong)local_45c;
  local_458 = uVar3;
  sVar5 = fread(&local_418,1,uVar15,__stream);
  if (sVar5 == uVar15) {
    if (*(char *)((long)&local_418 + (ulong)(uVar13 - 1)) != '\0') {
      pcVar8 = "Bad title in dump file\n";
      lVar9 = 0x39e;
LAB_0014142e:
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
              ,lVar9,pcVar8);
      goto LAB_0014145b;
    }
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
            ,0x3a1,"%s\n",&local_418);
    sVar5 = fread(&local_45c,4,1,__stream);
    if (sVar5 == 1) {
      if (0x3e6 < local_458) {
        local_45c = local_45c >> 0x18 | (local_45c & 0xff0000) >> 8 | (local_45c & 0xff00) << 8 |
                    local_45c << 0x18;
      }
      sVar14 = (size_t)(int)local_45c;
      sVar5 = fread(&local_418,1,sVar14,__stream);
      if (sVar5 != sVar14) {
        pcVar8 = "Cannot read header";
        lVar9 = 0x3aa;
        goto LAB_0014144f;
      }
      if (*(char *)((sVar14 - 1) + (long)&local_418) != '\0') {
        pcVar8 = "Bad header in dump file\n";
        lVar9 = 0x3ae;
        goto LAB_0014142e;
      }
      sVar5 = fread(&local_45c,4,1,__stream);
      uVar15 = local_440 & 0xffffffff;
      if (sVar5 == 1) {
        local_460 = 0;
        local_454 = 8;
        local_430 = 0x5f6572757478696d;
        local_420 = 0x20746e756f635f72;
LAB_001415a3:
        uVar3 = local_458;
        if (0x3e6 < local_458) {
          local_45c = local_45c >> 0x18 | (local_45c & 0xff0000) >> 8 | (local_45c & 0xff00) << 8 |
                      local_45c << 0x18;
        }
        uVar13 = (uint)uVar15;
        if (local_45c != 0) {
          sVar14 = (size_t)(int)local_45c;
          sVar5 = fread(&local_418,1,sVar14,__stream);
          if (sVar5 == sVar14) goto code_r0x001415e5;
          pcVar8 = "Cannot read header";
          lVar9 = 0x3bc;
          goto LAB_0014144f;
        }
        uVar17 = (uint)uVar11;
        uVar18 = uVar11;
        uVar10 = uVar13;
        local_444 = uVar17;
        local_434 = uVar13;
        if (local_460 == 0) {
          sVar5 = fread(&local_434,4,1,__stream);
          uVar10 = local_434;
          if (sVar5 != 1) {
            pcVar8 = "Cannot read #rows";
            lVar9 = 0x3d7;
            goto LAB_0014144f;
          }
          if (uVar3 < 999) {
            sVar5 = fread(&local_444,4,1,__stream);
            uVar10 = local_434;
            uVar3 = local_444;
            if (sVar5 != 1) {
LAB_001418bc:
              pcVar8 = "Cannot read #columns";
              lVar9 = 0x3dc;
              goto LAB_0014144f;
            }
          }
          else {
            sVar5 = fread(&local_444,4,1,__stream);
            if (sVar5 != 1) goto LAB_001418bc;
            uVar10 = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 |
                     uVar10 << 0x18;
            uVar3 = local_444 >> 0x18 | (local_444 & 0xff0000) >> 8 | (local_444 & 0xff00) << 8 |
                    local_444 << 0x18;
          }
          local_430 = (ulong)uVar3;
          err_msg(ERR_INFO,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                  ,0x3e0,"Rows: %d, Columns: %d\n",(ulong)uVar10);
          uVar18 = local_430;
        }
        uVar12 = local_450 & 0xffffffff;
        if ((int)local_450 != s->g->n_feat) {
          pcVar8 = "Number of feature streams mismatch: %d != %d\n";
          lVar9 = 0x3e5;
LAB_001418ef:
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                  ,lVar9,pcVar8,uVar12);
          goto LAB_0014145b;
        }
        if (uVar13 != s->g->n_density) {
          pcVar8 = "Number of densities mismatch: %d != %d\n";
          lVar9 = 0x3ea;
          uVar12 = uVar15;
          goto LAB_001418ef;
        }
        if (uVar17 != s->n_sen) {
          pcVar8 = "Number of senones mismatch: %d != %d\n";
          lVar9 = 0x3ef;
          uVar12 = uVar11;
          goto LAB_001418ef;
        }
        local_440 = CONCAT44(local_440._4_4_,uVar13);
        local_458 = uVar10;
        local_430 = uVar18;
        if (local_460 != 0) {
          if (local_460 == 0xf) {
            local_460 = 0x10;
          }
          else if (local_460 != 0x10) {
            pcVar8 = "Cluster count must be 0, 15, or 16\n";
            lVar9 = 0x3f4;
            goto LAB_0014142e;
          }
        }
        if ((local_454 != 4) && (local_454 != 8)) {
          pcVar8 = "Cluster count must be 4 or 8\n";
          lVar9 = 0x3fb;
          goto LAB_0014142e;
        }
        if ((int)local_428 == 0) {
          lVar9 = ftell(__stream);
          if (local_460 == 0) goto LAB_001419d9;
          uVar11 = (ulong)local_460;
          __ptr = (uint8 *)__ckd_calloc__(1,uVar11,
                                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                                          ,0x410);
          s->mixw_cb = __ptr;
          sVar5 = fread(__ptr,1,uVar11,__stream);
          if (sVar5 == uVar11) goto LAB_001419d9;
          lVar9 = 0x412;
LAB_00141b6d:
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                  ,lVar9,"Failed to read %d bytes from sendump\n",(ulong)local_460);
          goto LAB_0014145b;
        }
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                ,0x400,"Using memory-mapped I/O for senones\n");
        lVar9 = ftell(__stream);
        mf = mmio_file_read(file);
        s->sendump_mmap = mf;
        if (local_460 != 0) {
          pvVar6 = mmio_file_ptr(mf);
          s->mixw_cb = (uint8 *)((long)pvVar6 + lVar9);
          lVar9 = lVar9 + (ulong)local_460;
        }
LAB_001419d9:
        if (s->sendump_mmap == (mmio_file_t *)0x0) {
          pppuVar7 = (uint8 ***)
                     __ckd_calloc_3d__((long)(int)local_450,(long)(int)(uint)local_440,
                                       (long)(int)uVar17,1,
                                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                                       ,0x426);
          s->mixw = pppuVar7;
          if (0 < (int)local_450) {
            iVar2 = (int)local_430;
            iVar4 = (iVar2 - (iVar2 + 1 >> 0x1f)) + 1 >> 1;
            if (local_454 != 4) {
              iVar4 = iVar2;
            }
            local_428 = local_450 & 0xffffffff;
            local_440 = CONCAT44(local_440._4_4_,iVar4);
            uVar15 = (ulong)local_458;
            uVar11 = 0;
            do {
              if (0 < (int)local_458) {
                uVar18 = 0;
                do {
                  sVar5 = fread(s->mixw[uVar11][uVar18],1,(long)iVar4,__stream);
                  if (sVar5 != (long)iVar4) {
                    lVar9 = 0x42f;
                    local_460 = (uint)local_440;
                    goto LAB_00141b6d;
                  }
                  uVar18 = uVar18 + 1;
                } while (uVar15 != uVar18);
              }
              uVar11 = uVar11 + 1;
              iVar16 = 0;
            } while (uVar11 != local_428);
            goto LAB_00141461;
          }
        }
        else {
          pppuVar7 = (uint8 ***)
                     __ckd_calloc_2d__((long)(int)local_450,(long)(int)(uint)local_440,8,
                                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                                       ,0x41a);
          s->mixw = pppuVar7;
          if (0 < (int)local_450) {
            iVar2 = (int)local_430;
            iVar4 = (iVar2 - (iVar2 + 1 >> 0x1f)) + 1 >> 1;
            if (local_454 != 4) {
              iVar4 = iVar2;
            }
            local_440 = local_450 & 0xffffffff;
            local_428 = (ulong)iVar4;
            uVar11 = (ulong)local_458;
            uVar15 = 0;
            local_450 = uVar11;
            do {
              if (0 < (int)local_458) {
                uVar18 = 0;
                do {
                  pvVar6 = mmio_file_ptr(s->sendump_mmap);
                  s->mixw[uVar15][uVar18] = (uint8 *)((long)pvVar6 + lVar9);
                  lVar9 = lVar9 + local_428;
                  uVar18 = uVar18 + 1;
                } while (uVar11 != uVar18);
              }
              uVar15 = uVar15 + 1;
              iVar16 = 0;
            } while (uVar15 != local_440);
            goto LAB_00141461;
          }
        }
        iVar16 = 0;
        goto LAB_00141461;
      }
LAB_001416ef:
      pcVar8 = "Failed to read header string size from %s";
      lVar9 = 0x3b5;
    }
    else {
      pcVar8 = "Failed to read header size from %s";
      lVar9 = 0x3a5;
    }
LAB_001413da:
    err_msg_system(ERR_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                   ,lVar9,pcVar8,file);
  }
  else {
    pcVar8 = "Cannot read title";
    lVar9 = 0x39a;
LAB_0014144f:
    err_msg_system(ERR_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                   ,lVar9,pcVar8);
  }
LAB_0014145b:
  iVar16 = -1;
LAB_00141461:
  fclose(__stream);
  return iVar16;
code_r0x001415e5:
  if (CONCAT17(local_40b,CONCAT16(local_40c,CONCAT42(local_410,uStack_412))) == 0x20746e756f635f65
      && CONCAT26(uStack_412,CONCAT15(uStack_413,local_418)) == 0x5f65727574616566) {
    iVar2 = atoi(local_40a);
    local_450 = CONCAT44(local_450._4_4_,iVar2);
  }
  if (CONCAT17(local_40b,CONCAT16(local_40c,CONCAT42(local_410,uStack_412))) == 0x20746e756f635f65
      && CONCAT26(uStack_412,CONCAT15(uStack_413,local_418)) == local_430) {
    uVar3 = atoi(local_40a);
    uVar15 = (ulong)uVar3;
  }
  if (local_410 == 0x20746e75 &&
      CONCAT26(uStack_412,CONCAT15(uStack_413,local_418)) == 0x6f635f6c65646f6d) {
    uVar3 = atoi(&local_40c);
    uVar11 = (ulong)uVar3;
  }
  if (CONCAT17(local_40b,CONCAT16(local_40c,CONCAT42(local_410,uStack_412))) == local_420 &&
      CONCAT26(uStack_412,CONCAT15(uStack_413,local_418)) == 0x5f72657473756c63) {
    local_460 = atoi(local_40a);
  }
  if (CONCAT17(local_40c,CONCAT43(local_410,CONCAT21(uStack_412,uStack_413))) == 0x20737469625f7265
      && CONCAT26(uStack_412,CONCAT15(uStack_413,local_418)) == 0x5f72657473756c63) {
    local_454 = atoi(&local_40b);
  }
  sVar5 = fread(&local_45c,4,1,__stream);
  if (sVar5 != 1) goto LAB_001416ef;
  goto LAB_001415a3;
}

Assistant:

static int32
read_sendump(ptm_mgau_t *s, bin_mdef_t *mdef, char const *file)
{
    FILE *fp;
    char line[1000];
    int32 i, n, r, c;
    int32 do_swap, do_mmap;
    size_t offset;
    int n_clust = 0;
    int n_feat = s->g->n_feat;
    int n_density = s->g->n_density;
    int n_sen = bin_mdef_n_sen(mdef);
    int n_bits = 8;

    s->n_sen = n_sen; /* FIXME: Should have been done earlier */
    do_mmap = ps_config_bool(s->config, "mmap");

    if ((fp = fopen(file, "rb")) == NULL)
        return -1;

    E_INFO("Loading senones from dump file %s\n", file);
    /* Read title size, title */
    if (fread(&n, sizeof(int32), 1, fp) != 1) {
        E_ERROR_SYSTEM("Failed to read title size from %s", file);
        goto error_out;
    }
    /* This is extremely bogus */
    do_swap = 0;
    if (n < 1 || n > 999) {
        SWAP_INT32(&n);
        if (n < 1 || n > 999) {
            E_ERROR("Title length %x in dump file %s out of range\n", n, file);
            goto error_out;
        }
        do_swap = 1;
    }
    if (fread(line, sizeof(char), n, fp) != (size_t)n) {
        E_ERROR_SYSTEM("Cannot read title");
        goto error_out;
    }
    if (line[n - 1] != '\0') {
        E_ERROR("Bad title in dump file\n");
        goto error_out;
    }
    E_INFO("%s\n", line);

    /* Read header size, header */
    if (fread(&n, sizeof(n), 1, fp) != 1) {
        E_ERROR_SYSTEM("Failed to read header size from %s", file);
        goto error_out;
    }
    if (do_swap) SWAP_INT32(&n);
    if (fread(line, sizeof(char), n, fp) != (size_t)n) {
        E_ERROR_SYSTEM("Cannot read header");
        goto error_out;
    }
    if (line[n - 1] != '\0') {
        E_ERROR("Bad header in dump file\n");
        goto error_out;
    }

    /* Read other header strings until string length = 0 */
    for (;;) {
        if (fread(&n, sizeof(n), 1, fp) != 1) {
            E_ERROR_SYSTEM("Failed to read header string size from %s", file);
            goto error_out;
        }
        if (do_swap) SWAP_INT32(&n);
        if (n == 0)
            break;
        if (fread(line, sizeof(char), n, fp) != (size_t)n) {
            E_ERROR_SYSTEM("Cannot read header");
            goto error_out;
        }
        /* Look for a cluster count, if present */
        if (!strncmp(line, "feature_count ", strlen("feature_count "))) {
            n_feat = atoi(line + strlen("feature_count "));
        }
        if (!strncmp(line, "mixture_count ", strlen("mixture_count "))) {
            n_density = atoi(line + strlen("mixture_count "));
        }
        if (!strncmp(line, "model_count ", strlen("model_count "))) {
            n_sen = atoi(line + strlen("model_count "));
        }
        if (!strncmp(line, "cluster_count ", strlen("cluster_count "))) {
            n_clust = atoi(line + strlen("cluster_count "));
        }
        if (!strncmp(line, "cluster_bits ", strlen("cluster_bits "))) {
            n_bits = atoi(line + strlen("cluster_bits "));
        }
    }

    /* Defaults for #rows, #columns in mixw array. */
    c = n_sen;
    r = n_density;
    if (n_clust == 0) {
        /* Older mixw files have them here, and they might be padded. */
        if (fread(&r, sizeof(r), 1, fp) != 1) {
            E_ERROR_SYSTEM("Cannot read #rows");
            goto error_out;
        }
        if (do_swap) SWAP_INT32(&r);
        if (fread(&c, sizeof(c), 1, fp) != 1) {
            E_ERROR_SYSTEM("Cannot read #columns");
            goto error_out;
        }
        if (do_swap) SWAP_INT32(&c);
        E_INFO("Rows: %d, Columns: %d\n", r, c);
    }

    if (n_feat != s->g->n_feat) {
        E_ERROR("Number of feature streams mismatch: %d != %d\n",
                n_feat, s->g->n_feat);
        goto error_out;
    }
    if (n_density != s->g->n_density) {
        E_ERROR("Number of densities mismatch: %d != %d\n",
                n_density, s->g->n_density);
        goto error_out;
    }
    if (n_sen != s->n_sen) {
        E_ERROR("Number of senones mismatch: %d != %d\n",
                n_sen, s->n_sen);
        goto error_out;
    }

    if (!((n_clust == 0) || (n_clust == 15) || (n_clust == 16))) {
        E_ERROR("Cluster count must be 0, 15, or 16\n");
        goto error_out;
    }
    if (n_clust == 15)
        ++n_clust;

    if (!((n_bits == 8) || (n_bits == 4))) {
        E_ERROR("Cluster count must be 4 or 8\n");
        goto error_out;
    }

    if (do_mmap) {
            E_INFO("Using memory-mapped I/O for senones\n");
    }
    offset = ftell(fp);

    /* Allocate memory for pdfs (or memory map them) */
    if (do_mmap) {
        s->sendump_mmap = mmio_file_read(file);
        /* Get cluster codebook if any. */
        if (n_clust) {
            s->mixw_cb = ((uint8 *) mmio_file_ptr(s->sendump_mmap)) + offset;
            offset += n_clust;
        }
    }
    else {
        /* Get cluster codebook if any. */
        if (n_clust) {
            s->mixw_cb = ckd_calloc(1, n_clust);
            if (fread(s->mixw_cb, 1, n_clust, fp) != (size_t) n_clust) {
                E_ERROR("Failed to read %d bytes from sendump\n", n_clust);
                goto error_out;
            }
        }
    }

    /* Set up pointers, or read, or whatever */
    if (s->sendump_mmap) {
        s->mixw = ckd_calloc_2d(n_feat, n_density, sizeof(*s->mixw));
        for (n = 0; n < n_feat; n++) {
            int step = c;
            if (n_bits == 4)
                step = (step + 1) / 2;
            for (i = 0; i < r; i++) {
                s->mixw[n][i] = ((uint8 *) mmio_file_ptr(s->sendump_mmap)) + offset;
                offset += step;
            }
        }
    }
    else {
        s->mixw = ckd_calloc_3d(n_feat, n_density, n_sen, sizeof(***s->mixw));
        /* Read pdf values and ids */
        for (n = 0; n < n_feat; n++) {
            int step = c;
            if (n_bits == 4)
                step = (step + 1) / 2;
            for (i = 0; i < r; i++) {
                if (fread(s->mixw[n][i], sizeof(***s->mixw), step, fp)
                    != (size_t) step) {
                    E_ERROR("Failed to read %d bytes from sendump\n", step);
                    goto error_out;
                }
            }
        }
    }

    fclose(fp);
    return 0;
error_out:
    fclose(fp);
    return -1;
}